

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_data.cpp
# Opt level: O3

void __thiscall FGLROptions::FGLROptions(FGLROptions *this)

{
  int iVar1;
  
  (this->super_FOptionalMapinfoData).Next = (FOptionalMapinfoData *)0x0;
  (this->super_FOptionalMapinfoData).identifier.Index = 0;
  (this->super_FOptionalMapinfoData)._vptr_FOptionalMapinfoData =
       (_func_int **)&PTR__FOptionalMapinfoData_00869088;
  iVar1 = FName::NameManager::FindName(&FName::NameData,"gl_renderer",false);
  (this->super_FOptionalMapinfoData).identifier.Index = iVar1;
  this->brightfog = 0;
  *(undefined8 *)&(this->super_FOptionalMapinfoData).field_0x14 = 0;
  this->skyfog = 0;
  this->lightmode = -1;
  this->nocoloredspritelighting = -1;
  this->notexturefill = -1;
  (this->skyrotatevector2).Y = 0.0;
  (this->skyrotatevector2).Z = 1.0;
  (this->skyrotatevector).X = 0.0;
  (this->skyrotatevector).Y = 0.0;
  *(undefined8 *)&(this->skyrotatevector).Z = 0x3f800000;
  this->pixelstretch = 1.2;
  return;
}

Assistant:

FGLROptions()
	{
		identifier = "gl_renderer";
		fogdensity = 0;
		outsidefogdensity = 0;
		skyfog = 0;
		brightfog = false;
		lightmode = -1;
		nocoloredspritelighting = -1;
		notexturefill = -1;
		skyrotatevector = FVector3(0,0,1);
		skyrotatevector2 = FVector3(0,0,1);
		pixelstretch = 1.2f;
	}